

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

Var Js::JavascriptRegExp::EntryCompile(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  charcount_t csz;
  int iVar5;
  int iVar6;
  charcount_t cszOpts;
  BOOL BVar7;
  undefined4 *puVar8;
  JavascriptRegExp *pJVar9;
  Var pvVar10;
  JavascriptRegExp *pJVar11;
  JavascriptString *pJVar12;
  RecyclableObject *pRVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RegexPattern *pRVar14;
  char *pcVar15;
  char *pcVar16;
  uint uVar17;
  char *pcVar18;
  RegexPattern *pRVar19;
  int in_stack_00000010;
  undefined1 local_50 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  char16 *pszOpts;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x222,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00d058bc;
    *puVar8 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_50 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_50,(CallInfo *)&args.super_Arguments.Values);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pJVar9 = GetJavascriptRegExp((Arguments *)local_50,L"RegExp.prototype.compile",pSVar2);
  if (((uint)args.super_Arguments.Values & 0xffffff) == 1) {
    pRVar14 = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->emptyRegexPattern).ptr;
    pRVar19 = (RegexPattern *)0x0;
    goto LAB_00d057b4;
  }
  pvVar10 = Arguments::operator[]((Arguments *)local_50,1);
  bVar4 = VarIs<Js::JavascriptRegExp>(pvVar10);
  pvVar10 = Arguments::operator[]((Arguments *)local_50,1);
  if (!bVar4) {
    bVar4 = VarIs<Js::JavascriptString>(pvVar10);
    pvVar10 = Arguments::operator[]((Arguments *)local_50,1);
    if (bVar4) {
      pJVar12 = VarTo<Js::JavascriptString>(pvVar10);
    }
    else {
      if (pvVar10 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar4) goto LAB_00d058bc;
        *puVar8 = 0;
LAB_00d055e3:
        pRVar13 = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
        if (pRVar13 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar4) goto LAB_00d058bc;
          *puVar8 = 0;
        }
        TVar1 = ((pRVar13->type).ptr)->typeId;
        if ((int)TVar1 < 0x58) {
          if (TVar1 == TypeIds_Undefined) {
            pJVar12 = JavascriptLibrary::GetEmptyString
                                ((pSVar2->super_ScriptContextBase).javascriptLibrary);
            goto LAB_00d056dd;
          }
        }
        else {
          BVar7 = RecyclableObject::IsExternal(pRVar13);
          if (BVar7 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar8 = 1;
            pcVar18 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
            ;
            pcVar16 = "(typeId < TypeIds_Limit || obj->IsExternal())";
            pcVar15 = "GetTypeId aValue has invalid TypeId";
            uVar17 = 0xe;
            goto LAB_00d056b0;
          }
        }
      }
      else if (((ulong)pvVar10 & 0x1ffff00000000) == 0x1000000000000 ||
               ((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000) {
        if ((ulong)pvVar10 >> 0x32 == 0 && ((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000)
        goto LAB_00d055e3;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        pcVar18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
        ;
        pcVar16 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
        pcVar15 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
        uVar17 = 0x2a;
LAB_00d056b0:
        bVar4 = Throw::ReportAssert(pcVar18,uVar17,pcVar16,pcVar15);
        if (!bVar4) goto LAB_00d058bc;
        *puVar8 = 0;
      }
      pvVar10 = Arguments::operator[]((Arguments *)local_50,1);
      pJVar12 = JavascriptConversion::ToString(pvVar10,pSVar2);
    }
LAB_00d056dd:
    csz = JavascriptString::GetLength(pJVar12);
    iVar5 = (*(pJVar12->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])(pJVar12);
    if (((uint)args.super_Arguments.Values & 0xffffff) < 3) {
      cszOpts = 0;
      pszOpts = (char16 *)0x0;
    }
    else {
      pvVar10 = Arguments::operator[]((Arguments *)local_50,2);
      BVar7 = JavascriptOperators::IsUndefinedObject(pvVar10);
      if (BVar7 == 0) {
        pvVar10 = Arguments::operator[]((Arguments *)local_50,2);
        bVar4 = VarIs<Js::JavascriptString>(pvVar10);
        pvVar10 = Arguments::operator[]((Arguments *)local_50,2);
        if (bVar4) {
          pJVar12 = VarTo<Js::JavascriptString>(pvVar10);
        }
        else {
          pJVar12 = JavascriptConversion::ToString(pvVar10,pSVar2);
        }
        iVar6 = (*(pJVar12->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar12);
        pszOpts = (char16 *)CONCAT44(extraout_var_00,iVar6);
        cszOpts = JavascriptString::GetLength(pJVar12);
      }
      else {
        cszOpts = 0;
        pszOpts = (char16 *)0x0;
      }
    }
    pRVar19 = (RegexPattern *)0x0;
    pRVar14 = RegexHelper::CompileDynamic
                        (pSVar2,(char16 *)CONCAT44(extraout_var,iVar5),csz,pszOpts,cszOpts,false);
    goto LAB_00d057b4;
  }
  pJVar11 = VarTo<Js::JavascriptRegExp>(pvVar10);
  pRVar14 = (pJVar11->pattern).ptr;
  pRVar19 = (pJVar11->splitPattern).ptr;
  if (((uint)args.super_Arguments.Values & 0xffffff) < 3) goto LAB_00d057b4;
  pvVar10 = Arguments::operator[]((Arguments *)local_50,2);
  if (pvVar10 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00d058bc;
    *puVar8 = 0;
LAB_00d054ee:
    pRVar13 = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
    if (pRVar13 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00d058bc;
      *puVar8 = 0;
    }
    TVar1 = ((pRVar13->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_Undefined) {
LAB_00d057b4:
        Memory::Recycler::WBSetBit((char *)&pJVar9->pattern);
        (pJVar9->pattern).ptr = pRVar14;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&pJVar9->pattern);
        Memory::Recycler::WBSetBit((char *)&pJVar9->splitPattern);
        (pJVar9->splitPattern).ptr = pRVar19;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&pJVar9->splitPattern);
        (pJVar9->lastIndexVar).ptr = (void *)0x0;
        pJVar9->lastIndexOrFlag = 0;
        return pJVar9;
      }
      goto LAB_00d058ad;
    }
    BVar7 = RecyclableObject::IsExternal(pRVar13);
    if (BVar7 != 0) goto LAB_00d058ad;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    pcVar18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
    ;
    pcVar16 = "(typeId < TypeIds_Limit || obj->IsExternal())";
    pcVar15 = "GetTypeId aValue has invalid TypeId";
    uVar17 = 0xe;
  }
  else {
    if (((ulong)pvVar10 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar10 >> 0x32 != 0) ||
         (((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000)) goto LAB_00d058ad;
      goto LAB_00d054ee;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    pcVar18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    pcVar16 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar15 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar17 = 0x2a;
  }
  bVar4 = Throw::ReportAssert(pcVar18,uVar17,pcVar16,pcVar15);
  if (!bVar4) {
LAB_00d058bc:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar8 = 0;
LAB_00d058ad:
  JavascriptError::ThrowSyntaxError(pSVar2,-0x7ff5ec67,(PCWSTR)0x0);
}

Assistant:

Var JavascriptRegExp::EntryCompile(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        JavascriptRegExp* thisRegularExpression = GetJavascriptRegExp(args, _u("RegExp.prototype.compile"), scriptContext);

        UnifiedRegex::RegexPattern* pattern;
        UnifiedRegex::RegexPattern* splitPattern = nullptr;

        if (callInfo.Count == 1 )
        {
            pattern = scriptContext->GetLibrary()->GetEmptyRegexPattern();
        }
        else if (VarIs<JavascriptRegExp>(args[1]))
        {
            JavascriptRegExp* source = VarTo<JavascriptRegExp>(args[1]);
            //compile with a regular expression
            pattern = source->GetPattern();
            splitPattern = source->GetSplitPattern();
            // second arg must be undefined if a reg expression is passed
            if(callInfo.Count > 2 &&  JavascriptOperators::GetTypeId(args[2]) != TypeIds_Undefined)
            {
                JavascriptError::ThrowSyntaxError(scriptContext, JSERR_RegExpSyntax);
            }
        }
        else
        {
            //compile with a string
            JavascriptString * strBody;
            if (VarIs<JavascriptString>(args[1]))
            {
                strBody = VarTo<JavascriptString>(args[1]);
            }
            else if(JavascriptOperators::GetTypeId(args[1]) == TypeIds_Undefined)
            {
                strBody = scriptContext->GetLibrary()->GetEmptyString();
            }
            else
            {
                strBody = JavascriptConversion::ToString(args[1], scriptContext);
            }

            int cBody = strBody->GetLength();
            const char16 *szRegex = strBody->GetSz(); // must be null terminated!
            int cOpts = 0;
            const char16 *szOptions = nullptr;

            JavascriptString * strOptions = nullptr;
            if (callInfo.Count > 2 && !JavascriptOperators::IsUndefinedObject(args[2]))
            {
                if (VarIs<JavascriptString>(args[2]))
                {
                    strOptions = VarTo<JavascriptString>(args[2]);
                }
                else
                {
                    strOptions = JavascriptConversion::ToString(args[2], scriptContext);
                }

                szOptions = strOptions->GetSz(); // must be null terminated!
                cOpts = strOptions->GetLength();
            }

            pattern = RegexHelper::CompileDynamic(scriptContext, szRegex, cBody, szOptions, cOpts, false);
        }

        thisRegularExpression->SetPattern(pattern);
        thisRegularExpression->SetSplitPattern(splitPattern);
        thisRegularExpression->SetLastIndex(0);
        return thisRegularExpression;
    }